

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToastOverlay.cpp
# Opt level: O3

void cursespp::ToastOverlay::Show(string *text,int durationMs)

{
  ToastOverlay *this;
  OverlayStack *this_00;
  shared_ptr<cursespp::ToastOverlay> overlay;
  ILayoutPtr local_38;
  long local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  this = (ToastOverlay *)operator_new(0x2c8);
  ToastOverlay(this,text,(long)durationMs);
  std::__shared_ptr<cursespp::ToastOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ToastOverlay,void>
            ((__shared_ptr<cursespp::ToastOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_28,this);
  this_00 = App::Overlays();
  local_38.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(local_28 + 0x110);
  if (local_28 == 0) {
    local_38.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_38.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_20;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this_00,&local_38);
  if (local_38.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

void ToastOverlay::Show(const std::string& text, int durationMs) {
    std::shared_ptr<ToastOverlay> overlay(new ToastOverlay(text, durationMs));
    App::Overlays().Push(overlay);
}